

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O0

ssize_t __thiscall JSON::JSON_blob::write(JSON_blob *this,int __fd,void *__buf,size_t __n)

{
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  Pipeline *this_00;
  undefined1 local_a0 [8];
  Pl_Base64 base64;
  Pl_Concatenate cat;
  size_t param_2_local;
  Pipeline *p_local;
  JSON_blob *this_local;
  
  this_00 = (Pipeline *)CONCAT44(in_register_00000034,__fd);
  Pipeline::operator<<(this_00,"\"");
  Pl_Concatenate::Pl_Concatenate((Pl_Concatenate *)&base64.end_of_data,"blob concatenate",this_00);
  Pl_Base64::Pl_Base64((Pl_Base64 *)local_a0,"blob base64",(Pipeline *)&base64.end_of_data,a_encode)
  ;
  std::function<void_(Pipeline_*)>::operator()(&this->fn,(Pipeline *)local_a0);
  Pl_Base64::finish((Pl_Base64 *)local_a0);
  Pipeline::operator<<(this_00,"\"");
  Pl_Base64::~Pl_Base64((Pl_Base64 *)local_a0);
  Pl_Concatenate::~Pl_Concatenate((Pl_Concatenate *)&base64.end_of_data);
  return extraout_RAX;
}

Assistant:

void
JSON::JSON_blob::write(Pipeline* p, size_t) const
{
    *p << "\"";
    Pl_Concatenate cat("blob concatenate", p);
    Pl_Base64 base64("blob base64", &cat, Pl_Base64::a_encode);
    fn(&base64);
    base64.finish();
    *p << "\"";
}